

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int all_blks_inside(int x16_idx,int y16_idx,int pixels_wide,int pixels_high)

{
  int idx;
  int all_inside;
  int pixels_high_local;
  int pixels_wide_local;
  int y16_idx_local;
  int x16_idx_local;
  
  all_inside = 1;
  for (idx = 0; idx < 4; idx = idx + 1) {
    all_inside = (uint)(y16_idx + (idx >> 1) * 8 < pixels_high) &
                 (uint)((int)(x16_idx + (idx & 1U) * 8) < pixels_wide) & all_inside;
  }
  return all_inside;
}

Assistant:

static inline int all_blks_inside(int x16_idx, int y16_idx, int pixels_wide,
                                  int pixels_high) {
  int all_inside = 1;
  for (int idx = 0; idx < 4; idx++) {
    all_inside &= ((x16_idx + GET_BLK_IDX_X(idx, 3)) < pixels_wide);
    all_inside &= ((y16_idx + GET_BLK_IDX_Y(idx, 3)) < pixels_high);
  }
  return all_inside;
}